

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_named_interface_blocks.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_4d997::flatten_named_interface_blocks_declarations::handle_rvalue
          (flatten_named_interface_blocks_declarations *this,ir_rvalue **rvalue)

{
  void *ctx;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  ir_dereference_record *piVar4;
  undefined4 extraout_var;
  glsl_type *pgVar6;
  glsl_type *pgVar7;
  char *pcVar8;
  hash_entry *phVar9;
  ir_dereference_variable *this_00;
  ir_dereference_array *deref_array_prev;
  ir_rvalue *piVar10;
  ir_dereference_array *deref_array;
  ir_dereference_variable *deref_var;
  ir_variable *found_var;
  hash_entry *entry;
  char *iface_field_name;
  ir_variable *var;
  ir_dereference_record *ir;
  ir_rvalue **rvalue_local;
  flatten_named_interface_blocks_declarations *this_local;
  ir_variable *piVar5;
  
  if ((*rvalue != (ir_rvalue *)0x0) &&
     (piVar4 = ir_instruction::as_dereference_record(&(*rvalue)->super_ir_instruction),
     piVar4 != (ir_dereference_record *)0x0)) {
    iVar3 = (*(piVar4->super_ir_dereference).super_ir_rvalue.super_ir_instruction.
              _vptr_ir_instruction[8])();
    piVar5 = (ir_variable *)CONCAT44(extraout_var,iVar3);
    if (((piVar5 != (ir_variable *)0x0) &&
        (((bVar2 = ir_variable::is_interface_instance(piVar5), bVar2 &&
          ((*(uint *)&piVar5->data >> 0xc & 0xf) != 1)) &&
         ((*(uint *)&piVar5->data >> 0xc & 0xf) != 2)))) &&
       (pgVar6 = ir_variable::get_interface_type(piVar5), pgVar6 != (glsl_type *)0x0)) {
      ctx = this->mem_ctx;
      pcVar8 = " out";
      if ((*(uint *)&piVar5->data >> 0xc & 0xf) == 4) {
        pcVar8 = " in";
      }
      pgVar7 = ir_variable::get_interface_type(piVar5);
      pgVar6 = (piVar4->record->type->fields).array + piVar4->field_idx;
      uVar1._0_1_ = pgVar6->vector_elements;
      uVar1._1_1_ = pgVar6->matrix_columns;
      uVar1._2_2_ = *(undefined2 *)&pgVar6->field_0xa;
      uVar1._4_4_ = pgVar6->length;
      pcVar8 = ralloc_asprintf(ctx,"%s %s.%s.%s",pcVar8 + 1,pgVar7->name,piVar5->name,uVar1);
      phVar9 = _mesa_hash_table_search(this->interface_namespace,pcVar8);
      if (phVar9 == (hash_entry *)0x0) {
        __assert_fail("entry",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_named_interface_blocks.cpp"
                      ,0x127,
                      "virtual void (anonymous namespace)::flatten_named_interface_blocks_declarations::handle_rvalue(ir_rvalue **)"
                     );
      }
      piVar5 = (ir_variable *)phVar9->data;
      this_00 = (ir_dereference_variable *)exec_node::operator_new(0x30,this->mem_ctx);
      ir_dereference_variable::ir_dereference_variable(this_00,piVar5);
      deref_array_prev = ir_instruction::as_dereference_array(&piVar4->record->super_ir_instruction)
      ;
      if (deref_array_prev == (ir_dereference_array *)0x0) {
        *rvalue = (ir_rvalue *)this_00;
      }
      else {
        piVar10 = process_array_ir(this->mem_ctx,deref_array_prev,(ir_rvalue *)this_00);
        *rvalue = piVar10;
      }
    }
  }
  return;
}

Assistant:

void
flatten_named_interface_blocks_declarations::handle_rvalue(ir_rvalue **rvalue)
{
   if (*rvalue == NULL)
      return;

   ir_dereference_record *ir = (*rvalue)->as_dereference_record();
   if (ir == NULL)
      return;

   ir_variable *var = ir->variable_referenced();
   if (var == NULL)
      return;

   if (!var->is_interface_instance())
      return;

   /* It should be possible to handle uniforms during this pass,
    * but, this will require changes to the other uniform block
    * support code.
    */
   if (var->data.mode == ir_var_uniform || var->data.mode == ir_var_shader_storage)
      return;

   if (var->get_interface_type() != NULL) {
      char *iface_field_name =
         ralloc_asprintf(mem_ctx, "%s %s.%s.%s",
                         var->data.mode == ir_var_shader_in ? "in" : "out",
                         var->get_interface_type()->name,
                         var->name,
                         ir->record->type->fields.structure[ir->field_idx].name);

      /* Find the variable in the set of flattened interface blocks */
      hash_entry *entry = _mesa_hash_table_search(interface_namespace,
                                                  iface_field_name);
      assert(entry);
      ir_variable *found_var = (ir_variable *) entry->data;

      ir_dereference_variable *deref_var =
         new(mem_ctx) ir_dereference_variable(found_var);

      ir_dereference_array *deref_array =
         ir->record->as_dereference_array();
      if (deref_array != NULL) {
         *rvalue = process_array_ir(mem_ctx, deref_array,
                                    (ir_rvalue *)deref_var);
      } else {
         *rvalue = deref_var;
      }
   }
}